

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  Scene *pSVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar70 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  float fVar94;
  undefined1 auVar95 [32];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar96 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  float fVar117;
  undefined1 auVar118 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_d24;
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  long local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  uint local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined8 local_bc0;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined4 local_a60;
  undefined4 uStack_a5c;
  undefined4 uStack_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 uStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800 [250];
  float fVar84;
  float fVar91;
  float fVar92;
  float fVar93;
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar94 = ray->tfar;
    if (0.0 <= fVar94) {
      puVar39 = local_800 + 1;
      aVar3 = (ray->dir).field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar45 = vandps_avx((undefined1  [16])aVar3,auVar45);
      auVar85._8_4_ = 0x219392ef;
      auVar85._0_8_ = 0x219392ef219392ef;
      auVar85._12_4_ = 0x219392ef;
      auVar45 = vcmpps_avx(auVar45,auVar85,1);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar85 = vdivps_avx(auVar86,(undefined1  [16])aVar3);
      auVar87._8_4_ = 0x5d5e0b6b;
      auVar87._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar87._12_4_ = 0x5d5e0b6b;
      auVar45 = vblendvps_avx(auVar85,auVar87,auVar45);
      auVar77._0_4_ = auVar45._0_4_ * 0.99999964;
      auVar77._4_4_ = auVar45._4_4_ * 0.99999964;
      auVar77._8_4_ = auVar45._8_4_ * 0.99999964;
      auVar77._12_4_ = auVar45._12_4_ * 0.99999964;
      auVar66._0_4_ = auVar45._0_4_ * 1.0000004;
      auVar66._4_4_ = auVar45._4_4_ * 1.0000004;
      auVar66._8_4_ = auVar45._8_4_ * 1.0000004;
      auVar66._12_4_ = auVar45._12_4_ * 1.0000004;
      uVar50 = *(undefined4 *)&(ray->org).field_0;
      local_c80._4_4_ = uVar50;
      local_c80._0_4_ = uVar50;
      local_c80._8_4_ = uVar50;
      local_c80._12_4_ = uVar50;
      auVar103 = ZEXT1664(local_c80);
      uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_c90._4_4_ = uVar50;
      local_c90._0_4_ = uVar50;
      local_c90._8_4_ = uVar50;
      local_c90._12_4_ = uVar50;
      auVar107 = ZEXT1664(local_c90);
      uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_ca0._4_4_ = uVar50;
      local_ca0._0_4_ = uVar50;
      local_ca0._8_4_ = uVar50;
      local_ca0._12_4_ = uVar50;
      auVar110 = ZEXT1664(local_ca0);
      auVar45 = vmovshdup_avx(auVar77);
      local_cc0 = vshufps_avx(auVar77,auVar77,0x55);
      auVar116 = ZEXT1664(local_cc0);
      auVar85 = vshufpd_avx(auVar77,auVar77,1);
      local_cd0 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar83 = ZEXT1664(local_cd0);
      local_cf0 = vshufps_avx(auVar66,auVar66,0x55);
      auVar119 = ZEXT1664(local_cf0);
      uVar36 = (ulong)(auVar77._0_4_ < 0.0) << 4;
      local_d00 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar70 = ZEXT1664(local_d00);
      uVar40 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x20;
      uVar41 = (ulong)(auVar85._0_4_ < 0.0) << 4 | 0x40;
      uVar42 = uVar36 ^ 0x10;
      uVar43 = uVar40 ^ 0x10;
      uVar50 = auVar44._0_4_;
      local_d10._4_4_ = uVar50;
      local_d10._0_4_ = uVar50;
      local_d10._8_4_ = uVar50;
      local_d10._12_4_ = uVar50;
      auVar90 = ZEXT1664(local_d10);
      local_d20._4_4_ = fVar94;
      local_d20._0_4_ = fVar94;
      local_d20._8_4_ = fVar94;
      local_d20._12_4_ = fVar94;
      auVar96 = ZEXT1664(local_d20);
      local_a80._16_16_ = mm_lookupmask_ps._240_16_;
      local_a80._0_16_ = mm_lookupmask_ps._0_16_;
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar59._16_4_ = 0x3f800000;
      auVar59._20_4_ = 0x3f800000;
      auVar59._24_4_ = 0x3f800000;
      auVar59._28_4_ = 0x3f800000;
      auVar46._8_4_ = 0xbf800000;
      auVar46._0_8_ = 0xbf800000bf800000;
      auVar46._12_4_ = 0xbf800000;
      auVar46._16_4_ = 0xbf800000;
      auVar46._20_4_ = 0xbf800000;
      auVar46._24_4_ = 0xbf800000;
      auVar46._28_4_ = 0xbf800000;
      _local_aa0 = vblendvps_avx(auVar59,auVar46,local_a80);
      local_cb0 = auVar77._0_4_;
      fStack_cac = auVar77._0_4_;
      fStack_ca8 = auVar77._0_4_;
      fStack_ca4 = auVar77._0_4_;
      local_ce0 = auVar66._0_4_;
      fStack_cdc = auVar66._0_4_;
      fStack_cd8 = auVar66._0_4_;
      fStack_cd4 = auVar66._0_4_;
      fVar94 = auVar77._0_4_;
      fVar97 = auVar77._0_4_;
      fVar98 = auVar77._0_4_;
      fVar99 = auVar66._0_4_;
      fVar100 = auVar66._0_4_;
      fVar101 = auVar66._0_4_;
LAB_0148f9be:
      if (puVar39 != local_800) {
        uVar38 = puVar39[-1];
        puVar39 = puVar39 + -1;
        while ((uVar38 & 8) == 0) {
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar36),auVar103._0_16_);
          auVar44._0_4_ = auVar77._0_4_ * auVar45._0_4_;
          auVar44._4_4_ = fVar94 * auVar45._4_4_;
          auVar44._8_4_ = fVar97 * auVar45._8_4_;
          auVar44._12_4_ = fVar98 * auVar45._12_4_;
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar40),auVar107._0_16_);
          auVar51._0_4_ = auVar116._0_4_ * auVar45._0_4_;
          auVar51._4_4_ = auVar116._4_4_ * auVar45._4_4_;
          auVar51._8_4_ = auVar116._8_4_ * auVar45._8_4_;
          auVar51._12_4_ = auVar116._12_4_ * auVar45._12_4_;
          auVar45 = vmaxps_avx(auVar44,auVar51);
          auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar41),auVar110._0_16_);
          auVar52._0_4_ = auVar83._0_4_ * auVar85._0_4_;
          auVar52._4_4_ = auVar83._4_4_ * auVar85._4_4_;
          auVar52._8_4_ = auVar83._8_4_ * auVar85._8_4_;
          auVar52._12_4_ = auVar83._12_4_ * auVar85._12_4_;
          auVar85 = vmaxps_avx(auVar52,auVar90._0_16_);
          auVar45 = vmaxps_avx(auVar45,auVar85);
          auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar42),auVar103._0_16_);
          auVar53._0_4_ = auVar66._0_4_ * auVar85._0_4_;
          auVar53._4_4_ = fVar99 * auVar85._4_4_;
          auVar53._8_4_ = fVar100 * auVar85._8_4_;
          auVar53._12_4_ = fVar101 * auVar85._12_4_;
          auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar43),auVar107._0_16_);
          auVar57._0_4_ = auVar119._0_4_ * auVar85._0_4_;
          auVar57._4_4_ = auVar119._4_4_ * auVar85._4_4_;
          auVar57._8_4_ = auVar119._8_4_ * auVar85._8_4_;
          auVar57._12_4_ = auVar119._12_4_ * auVar85._12_4_;
          auVar85 = vminps_avx(auVar53,auVar57);
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar41 ^ 0x10)),
                               auVar110._0_16_);
          auVar58._0_4_ = auVar70._0_4_ * auVar44._0_4_;
          auVar58._4_4_ = auVar70._4_4_ * auVar44._4_4_;
          auVar58._8_4_ = auVar70._8_4_ * auVar44._8_4_;
          auVar58._12_4_ = auVar70._12_4_ * auVar44._12_4_;
          auVar44 = vminps_avx(auVar58,auVar96._0_16_);
          auVar85 = vminps_avx(auVar85,auVar44);
          auVar45 = vcmpps_avx(auVar45,auVar85,2);
          uVar31 = vmovmskps_avx(auVar45);
          if (uVar31 == 0) goto LAB_0148f9be;
          uVar31 = uVar31 & 0xff;
          uVar32 = uVar38 & 0xfffffffffffffff0;
          lVar37 = 0;
          for (uVar38 = (ulong)uVar31; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
          {
            lVar37 = lVar37 + 1;
          }
          uVar38 = *(ulong *)(uVar32 + lVar37 * 8);
          uVar31 = uVar31 - 1 & uVar31;
          uVar34 = (ulong)uVar31;
          if (uVar31 != 0) {
            do {
              *puVar39 = uVar38;
              puVar39 = puVar39 + 1;
              lVar37 = 0;
              for (uVar38 = uVar34; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar37 = lVar37 + 1;
              }
              uVar34 = uVar34 - 1 & uVar34;
              uVar38 = *(ulong *)(uVar32 + lVar37 * 8);
            } while (uVar34 != 0);
          }
        }
        local_c68 = (ulong)((uint)uVar38 & 0xf) - 8;
        uVar38 = uVar38 & 0xfffffffffffffff0;
        for (lVar37 = 0; lVar37 != local_c68; lVar37 = lVar37 + 1) {
          lVar33 = lVar37 * 0xe0;
          lVar1 = uVar38 + 0xd0 + lVar33;
          local_a00 = *(undefined8 *)(lVar1 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar38 + 0xc0 + lVar33;
          local_9e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar47._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x60 + lVar33);
          auVar47._0_16_ = *(undefined1 (*) [16])(uVar38 + lVar33);
          auVar54._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x70 + lVar33);
          auVar54._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x10 + lVar33);
          auVar60._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x80 + lVar33);
          auVar60._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x20 + lVar33);
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0x30 + lVar33);
          auVar67._16_16_ = auVar45;
          auVar67._0_16_ = auVar45;
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0x40 + lVar33);
          auVar78._16_16_ = auVar45;
          auVar78._0_16_ = auVar45;
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0x50 + lVar33);
          auVar102._16_16_ = auVar45;
          auVar102._0_16_ = auVar45;
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0x90 + lVar33);
          auVar95._16_16_ = auVar45;
          auVar95._0_16_ = auVar45;
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0xa0 + lVar33);
          auVar104._16_16_ = auVar45;
          auVar104._0_16_ = auVar45;
          auVar45 = *(undefined1 (*) [16])(uVar38 + 0xb0 + lVar33);
          auVar127._16_16_ = auVar45;
          auVar127._0_16_ = auVar45;
          uVar50 = *(undefined4 *)&(ray->org).field_0;
          auVar114._4_4_ = uVar50;
          auVar114._0_4_ = uVar50;
          auVar114._8_4_ = uVar50;
          auVar114._12_4_ = uVar50;
          auVar114._16_4_ = uVar50;
          auVar114._20_4_ = uVar50;
          auVar114._24_4_ = uVar50;
          auVar114._28_4_ = uVar50;
          uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar118._4_4_ = uVar50;
          auVar118._0_4_ = uVar50;
          auVar118._8_4_ = uVar50;
          auVar118._12_4_ = uVar50;
          auVar118._16_4_ = uVar50;
          auVar118._20_4_ = uVar50;
          auVar118._24_4_ = uVar50;
          auVar118._28_4_ = uVar50;
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar126._4_4_ = uVar2;
          auVar126._0_4_ = uVar2;
          auVar126._8_4_ = uVar2;
          auVar126._12_4_ = uVar2;
          auVar126._16_4_ = uVar2;
          auVar126._20_4_ = uVar2;
          auVar126._24_4_ = uVar2;
          auVar126._28_4_ = uVar2;
          local_ac0 = vsubps_avx(auVar47,auVar114);
          local_b80 = vsubps_avx(auVar54,auVar118);
          local_ba0 = vsubps_avx(auVar60,auVar126);
          auVar46 = vsubps_avx(auVar67,auVar114);
          auVar59 = vsubps_avx(auVar78,auVar118);
          auVar89 = vsubps_avx(auVar102,auVar126);
          auVar47 = vsubps_avx(auVar95,auVar114);
          auVar54 = vsubps_avx(auVar104,auVar118);
          auVar12 = vsubps_avx(auVar127,auVar126);
          local_ae0 = vsubps_avx(auVar47,local_ac0);
          local_b20 = vsubps_avx(auVar54,local_b80);
          local_b00 = vsubps_avx(auVar12,local_ba0);
          auVar48._0_4_ = auVar47._0_4_ + local_ac0._0_4_;
          auVar48._4_4_ = auVar47._4_4_ + local_ac0._4_4_;
          auVar48._8_4_ = auVar47._8_4_ + local_ac0._8_4_;
          auVar48._12_4_ = auVar47._12_4_ + local_ac0._12_4_;
          auVar48._16_4_ = auVar47._16_4_ + local_ac0._16_4_;
          auVar48._20_4_ = auVar47._20_4_ + local_ac0._20_4_;
          auVar48._24_4_ = auVar47._24_4_ + local_ac0._24_4_;
          auVar48._28_4_ = auVar47._28_4_ + local_ac0._28_4_;
          auVar68._0_4_ = auVar54._0_4_ + local_b80._0_4_;
          auVar68._4_4_ = auVar54._4_4_ + local_b80._4_4_;
          auVar68._8_4_ = auVar54._8_4_ + local_b80._8_4_;
          auVar68._12_4_ = auVar54._12_4_ + local_b80._12_4_;
          auVar68._16_4_ = auVar54._16_4_ + local_b80._16_4_;
          auVar68._20_4_ = auVar54._20_4_ + local_b80._20_4_;
          auVar68._24_4_ = auVar54._24_4_ + local_b80._24_4_;
          auVar68._28_4_ = auVar54._28_4_ + local_b80._28_4_;
          fVar5 = local_ba0._0_4_;
          auVar79._0_4_ = auVar12._0_4_ + fVar5;
          fVar6 = local_ba0._4_4_;
          auVar79._4_4_ = auVar12._4_4_ + fVar6;
          fVar7 = local_ba0._8_4_;
          auVar79._8_4_ = auVar12._8_4_ + fVar7;
          fVar8 = local_ba0._12_4_;
          auVar79._12_4_ = auVar12._12_4_ + fVar8;
          fVar9 = local_ba0._16_4_;
          auVar79._16_4_ = auVar12._16_4_ + fVar9;
          fVar10 = local_ba0._20_4_;
          auVar79._20_4_ = auVar12._20_4_ + fVar10;
          fVar11 = local_ba0._24_4_;
          auVar79._24_4_ = auVar12._24_4_ + fVar11;
          auVar79._28_4_ = auVar12._28_4_ + local_ba0._28_4_;
          auVar13._4_4_ = local_b00._4_4_ * auVar68._4_4_;
          auVar13._0_4_ = local_b00._0_4_ * auVar68._0_4_;
          auVar13._8_4_ = local_b00._8_4_ * auVar68._8_4_;
          auVar13._12_4_ = local_b00._12_4_ * auVar68._12_4_;
          auVar13._16_4_ = local_b00._16_4_ * auVar68._16_4_;
          auVar13._20_4_ = local_b00._20_4_ * auVar68._20_4_;
          auVar13._24_4_ = local_b00._24_4_ * auVar68._24_4_;
          auVar13._28_4_ = uVar50;
          auVar85 = vfmsub231ps_fma(auVar13,local_b20,auVar79);
          auVar14._4_4_ = auVar79._4_4_ * local_ae0._4_4_;
          auVar14._0_4_ = auVar79._0_4_ * local_ae0._0_4_;
          auVar14._8_4_ = auVar79._8_4_ * local_ae0._8_4_;
          auVar14._12_4_ = auVar79._12_4_ * local_ae0._12_4_;
          auVar14._16_4_ = auVar79._16_4_ * local_ae0._16_4_;
          auVar14._20_4_ = auVar79._20_4_ * local_ae0._20_4_;
          auVar14._24_4_ = auVar79._24_4_ * local_ae0._24_4_;
          auVar14._28_4_ = auVar79._28_4_;
          auVar45 = vfmsub231ps_fma(auVar14,local_b00,auVar48);
          auVar16._4_4_ = local_b20._4_4_ * auVar48._4_4_;
          auVar16._0_4_ = local_b20._0_4_ * auVar48._0_4_;
          auVar16._8_4_ = local_b20._8_4_ * auVar48._8_4_;
          auVar16._12_4_ = local_b20._12_4_ * auVar48._12_4_;
          auVar16._16_4_ = local_b20._16_4_ * auVar48._16_4_;
          auVar16._20_4_ = local_b20._20_4_ * auVar48._20_4_;
          auVar16._24_4_ = local_b20._24_4_ * auVar48._24_4_;
          auVar16._28_4_ = auVar48._28_4_;
          auVar44 = vfmsub231ps_fma(auVar16,local_ae0,auVar68);
          uVar50 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          local_c40._4_4_ = uVar50;
          local_c40._0_4_ = uVar50;
          local_c40._8_4_ = uVar50;
          local_c40._12_4_ = uVar50;
          local_c40._16_4_ = uVar50;
          local_c40._20_4_ = uVar50;
          local_c40._24_4_ = uVar50;
          local_c40._28_4_ = uVar50;
          local_bc0._4_4_ = (ray->dir).field_0.m128[2];
          auVar49._0_4_ = local_bc0._4_4_ * auVar44._0_4_;
          auVar49._4_4_ = local_bc0._4_4_ * auVar44._4_4_;
          auVar49._8_4_ = local_bc0._4_4_ * auVar44._8_4_;
          auVar49._12_4_ = local_bc0._4_4_ * auVar44._12_4_;
          auVar49._16_4_ = local_bc0._4_4_ * 0.0;
          auVar49._20_4_ = local_bc0._4_4_ * 0.0;
          auVar49._24_4_ = local_bc0._4_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar45 = vfmadd231ps_fma(auVar49,local_c40,ZEXT1632(auVar45));
          uVar50 = *(undefined4 *)&(ray->dir).field_0;
          local_c60._4_4_ = uVar50;
          local_c60._0_4_ = uVar50;
          local_c60._8_4_ = uVar50;
          local_c60._12_4_ = uVar50;
          local_c60._16_4_ = uVar50;
          local_c60._20_4_ = uVar50;
          local_c60._24_4_ = uVar50;
          local_c60._28_4_ = uVar50;
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),local_c60,ZEXT1632(auVar85));
          local_b40 = vsubps_avx(local_b80,auVar59);
          local_b60 = vsubps_avx(local_ba0,auVar89);
          auVar69._0_4_ = auVar59._0_4_ + local_b80._0_4_;
          auVar69._4_4_ = auVar59._4_4_ + local_b80._4_4_;
          auVar69._8_4_ = auVar59._8_4_ + local_b80._8_4_;
          auVar69._12_4_ = auVar59._12_4_ + local_b80._12_4_;
          auVar69._16_4_ = auVar59._16_4_ + local_b80._16_4_;
          auVar69._20_4_ = auVar59._20_4_ + local_b80._20_4_;
          auVar69._24_4_ = auVar59._24_4_ + local_b80._24_4_;
          auVar69._28_4_ = auVar59._28_4_ + local_b80._28_4_;
          auVar80._0_4_ = fVar5 + auVar89._0_4_;
          auVar80._4_4_ = fVar6 + auVar89._4_4_;
          auVar80._8_4_ = fVar7 + auVar89._8_4_;
          auVar80._12_4_ = fVar8 + auVar89._12_4_;
          auVar80._16_4_ = fVar9 + auVar89._16_4_;
          auVar80._20_4_ = fVar10 + auVar89._20_4_;
          auVar80._24_4_ = fVar11 + auVar89._24_4_;
          fVar94 = auVar89._28_4_;
          auVar80._28_4_ = local_ba0._28_4_ + fVar94;
          fVar117 = local_b60._0_4_;
          fVar120 = local_b60._4_4_;
          auVar17._4_4_ = fVar120 * auVar69._4_4_;
          auVar17._0_4_ = fVar117 * auVar69._0_4_;
          fVar121 = local_b60._8_4_;
          auVar17._8_4_ = fVar121 * auVar69._8_4_;
          fVar122 = local_b60._12_4_;
          auVar17._12_4_ = fVar122 * auVar69._12_4_;
          fVar123 = local_b60._16_4_;
          auVar17._16_4_ = fVar123 * auVar69._16_4_;
          fVar124 = local_b60._20_4_;
          auVar17._20_4_ = fVar124 * auVar69._20_4_;
          fVar125 = local_b60._24_4_;
          auVar17._24_4_ = fVar125 * auVar69._24_4_;
          auVar17._28_4_ = fVar94;
          auVar44 = vfmsub231ps_fma(auVar17,local_b40,auVar80);
          auVar13 = vsubps_avx(local_ac0,auVar46);
          fVar65 = auVar13._0_4_;
          fVar71 = auVar13._4_4_;
          auVar18._4_4_ = auVar80._4_4_ * fVar71;
          auVar18._0_4_ = auVar80._0_4_ * fVar65;
          fVar72 = auVar13._8_4_;
          auVar18._8_4_ = auVar80._8_4_ * fVar72;
          fVar73 = auVar13._12_4_;
          auVar18._12_4_ = auVar80._12_4_ * fVar73;
          fVar74 = auVar13._16_4_;
          auVar18._16_4_ = auVar80._16_4_ * fVar74;
          fVar75 = auVar13._20_4_;
          auVar18._20_4_ = auVar80._20_4_ * fVar75;
          fVar76 = auVar13._24_4_;
          auVar18._24_4_ = auVar80._24_4_ * fVar76;
          auVar18._28_4_ = local_b00._28_4_;
          auVar81._0_4_ = auVar46._0_4_ + local_ac0._0_4_;
          auVar81._4_4_ = auVar46._4_4_ + local_ac0._4_4_;
          auVar81._8_4_ = auVar46._8_4_ + local_ac0._8_4_;
          auVar81._12_4_ = auVar46._12_4_ + local_ac0._12_4_;
          auVar81._16_4_ = auVar46._16_4_ + local_ac0._16_4_;
          auVar81._20_4_ = auVar46._20_4_ + local_ac0._20_4_;
          auVar81._24_4_ = auVar46._24_4_ + local_ac0._24_4_;
          auVar81._28_4_ = auVar46._28_4_ + local_ac0._28_4_;
          auVar85 = vfmsub231ps_fma(auVar18,local_b60,auVar81);
          fVar84 = local_b40._0_4_;
          fVar91 = local_b40._4_4_;
          auVar19._4_4_ = fVar91 * auVar81._4_4_;
          auVar19._0_4_ = fVar84 * auVar81._0_4_;
          fVar92 = local_b40._8_4_;
          auVar19._8_4_ = fVar92 * auVar81._8_4_;
          fVar93 = local_b40._12_4_;
          auVar19._12_4_ = fVar93 * auVar81._12_4_;
          fVar111 = local_b40._16_4_;
          auVar19._16_4_ = fVar111 * auVar81._16_4_;
          fVar112 = local_b40._20_4_;
          auVar19._20_4_ = fVar112 * auVar81._20_4_;
          fVar113 = local_b40._24_4_;
          auVar19._24_4_ = fVar113 * auVar81._24_4_;
          auVar19._28_4_ = auVar81._28_4_;
          auVar66 = vfmsub231ps_fma(auVar19,auVar13,auVar69);
          auVar82._0_4_ = local_bc0._4_4_ * auVar66._0_4_;
          auVar82._4_4_ = local_bc0._4_4_ * auVar66._4_4_;
          auVar82._8_4_ = local_bc0._4_4_ * auVar66._8_4_;
          auVar82._12_4_ = local_bc0._4_4_ * auVar66._12_4_;
          auVar82._16_4_ = local_bc0._4_4_ * 0.0;
          auVar82._20_4_ = local_bc0._4_4_ * 0.0;
          auVar82._24_4_ = local_bc0._4_4_ * 0.0;
          auVar82._28_4_ = 0;
          auVar85 = vfmadd231ps_fma(auVar82,local_c40,ZEXT1632(auVar85));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_c60,ZEXT1632(auVar44));
          auVar14 = vsubps_avx(auVar46,auVar47);
          auVar61._0_4_ = auVar46._0_4_ + auVar47._0_4_;
          auVar61._4_4_ = auVar46._4_4_ + auVar47._4_4_;
          auVar61._8_4_ = auVar46._8_4_ + auVar47._8_4_;
          auVar61._12_4_ = auVar46._12_4_ + auVar47._12_4_;
          auVar61._16_4_ = auVar46._16_4_ + auVar47._16_4_;
          auVar61._20_4_ = auVar46._20_4_ + auVar47._20_4_;
          auVar61._24_4_ = auVar46._24_4_ + auVar47._24_4_;
          auVar61._28_4_ = auVar46._28_4_ + auVar47._28_4_;
          auVar47 = vsubps_avx(auVar59,auVar54);
          auVar88._0_4_ = auVar59._0_4_ + auVar54._0_4_;
          auVar88._4_4_ = auVar59._4_4_ + auVar54._4_4_;
          auVar88._8_4_ = auVar59._8_4_ + auVar54._8_4_;
          auVar88._12_4_ = auVar59._12_4_ + auVar54._12_4_;
          auVar88._16_4_ = auVar59._16_4_ + auVar54._16_4_;
          auVar88._20_4_ = auVar59._20_4_ + auVar54._20_4_;
          auVar88._24_4_ = auVar59._24_4_ + auVar54._24_4_;
          auVar88._28_4_ = auVar59._28_4_ + auVar54._28_4_;
          auVar54 = vsubps_avx(auVar89,auVar12);
          auVar55._0_4_ = auVar89._0_4_ + auVar12._0_4_;
          auVar55._4_4_ = auVar89._4_4_ + auVar12._4_4_;
          auVar55._8_4_ = auVar89._8_4_ + auVar12._8_4_;
          auVar55._12_4_ = auVar89._12_4_ + auVar12._12_4_;
          auVar55._16_4_ = auVar89._16_4_ + auVar12._16_4_;
          auVar55._20_4_ = auVar89._20_4_ + auVar12._20_4_;
          auVar55._24_4_ = auVar89._24_4_ + auVar12._24_4_;
          auVar55._28_4_ = fVar94 + auVar12._28_4_;
          auVar89._4_4_ = auVar54._4_4_ * auVar88._4_4_;
          auVar89._0_4_ = auVar54._0_4_ * auVar88._0_4_;
          auVar89._8_4_ = auVar54._8_4_ * auVar88._8_4_;
          auVar89._12_4_ = auVar54._12_4_ * auVar88._12_4_;
          auVar89._16_4_ = auVar54._16_4_ * auVar88._16_4_;
          auVar89._20_4_ = auVar54._20_4_ * auVar88._20_4_;
          auVar89._24_4_ = auVar54._24_4_ * auVar88._24_4_;
          auVar89._28_4_ = fVar94;
          auVar66 = vfmsub231ps_fma(auVar89,auVar47,auVar55);
          auVar12._4_4_ = auVar55._4_4_ * auVar14._4_4_;
          auVar12._0_4_ = auVar55._0_4_ * auVar14._0_4_;
          auVar12._8_4_ = auVar55._8_4_ * auVar14._8_4_;
          auVar12._12_4_ = auVar55._12_4_ * auVar14._12_4_;
          auVar12._16_4_ = auVar55._16_4_ * auVar14._16_4_;
          auVar12._20_4_ = auVar55._20_4_ * auVar14._20_4_;
          auVar12._24_4_ = auVar55._24_4_ * auVar14._24_4_;
          auVar12._28_4_ = auVar55._28_4_;
          auVar44 = vfmsub231ps_fma(auVar12,auVar54,auVar61);
          auVar20._4_4_ = auVar47._4_4_ * auVar61._4_4_;
          auVar20._0_4_ = auVar47._0_4_ * auVar61._0_4_;
          auVar20._8_4_ = auVar47._8_4_ * auVar61._8_4_;
          auVar20._12_4_ = auVar47._12_4_ * auVar61._12_4_;
          auVar20._16_4_ = auVar47._16_4_ * auVar61._16_4_;
          auVar20._20_4_ = auVar47._20_4_ * auVar61._20_4_;
          auVar20._24_4_ = auVar47._24_4_ * auVar61._24_4_;
          auVar20._28_4_ = auVar61._28_4_;
          auVar77 = vfmsub231ps_fma(auVar20,auVar14,auVar88);
          local_bc0._0_4_ = local_bc0._4_4_;
          fStack_bb8 = local_bc0._4_4_;
          fStack_bb4 = local_bc0._4_4_;
          fStack_bb0 = local_bc0._4_4_;
          fStack_bac = local_bc0._4_4_;
          fStack_ba8 = local_bc0._4_4_;
          fStack_ba4 = local_bc0._4_4_;
          auVar62._0_4_ = local_bc0._4_4_ * auVar77._0_4_;
          auVar62._4_4_ = local_bc0._4_4_ * auVar77._4_4_;
          auVar62._8_4_ = local_bc0._4_4_ * auVar77._8_4_;
          auVar62._12_4_ = local_bc0._4_4_ * auVar77._12_4_;
          auVar62._16_4_ = local_bc0._4_4_ * 0.0;
          auVar62._20_4_ = local_bc0._4_4_ * 0.0;
          auVar62._24_4_ = local_bc0._4_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar44 = vfmadd231ps_fma(auVar62,local_c40,ZEXT1632(auVar44));
          auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),local_c60,ZEXT1632(auVar66));
          local_9c0 = auVar45._0_4_;
          fStack_9bc = auVar45._4_4_;
          fStack_9b8 = auVar45._8_4_;
          fStack_9b4 = auVar45._12_4_;
          local_980 = ZEXT1632(CONCAT412(auVar44._12_4_ + fStack_9b4 + auVar85._12_4_,
                                         CONCAT48(auVar44._8_4_ + fStack_9b8 + auVar85._8_4_,
                                                  CONCAT44(auVar44._4_4_ +
                                                           fStack_9bc + auVar85._4_4_,
                                                           auVar44._0_4_ + local_9c0 + auVar85._0_4_
                                                          ))));
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar56._16_4_ = 0x7fffffff;
          auVar56._20_4_ = 0x7fffffff;
          auVar56._24_4_ = 0x7fffffff;
          auVar56._28_4_ = 0x7fffffff;
          local_a20 = ZEXT1632(auVar45);
          auVar46 = vminps_avx(local_a20,ZEXT1632(auVar85));
          auVar46 = vminps_avx(auVar46,ZEXT1632(auVar44));
          local_a40 = vandps_avx(local_980,auVar56);
          fVar94 = local_a40._0_4_ * 1.1920929e-07;
          fVar97 = local_a40._4_4_ * 1.1920929e-07;
          auVar21._4_4_ = fVar97;
          auVar21._0_4_ = fVar94;
          fVar98 = local_a40._8_4_ * 1.1920929e-07;
          auVar21._8_4_ = fVar98;
          auVar77._0_4_ = local_a40._12_4_ * 1.1920929e-07;
          auVar21._12_4_ = auVar77._0_4_;
          fVar99 = local_a40._16_4_ * 1.1920929e-07;
          auVar21._16_4_ = fVar99;
          fVar100 = local_a40._20_4_ * 1.1920929e-07;
          auVar21._20_4_ = fVar100;
          fVar101 = local_a40._24_4_ * 1.1920929e-07;
          auVar21._24_4_ = fVar101;
          auVar21._28_4_ = 0x34000000;
          auVar105._0_8_ = CONCAT44(fVar97,fVar94) ^ 0x8000000080000000;
          auVar105._8_4_ = -fVar98;
          auVar105._12_4_ = -auVar77._0_4_;
          auVar105._16_4_ = -fVar99;
          auVar105._20_4_ = -fVar100;
          auVar105._24_4_ = -fVar101;
          auVar105._28_4_ = 0xb4000000;
          auVar46 = vcmpps_avx(auVar46,auVar105,5);
          auVar89 = vmaxps_avx(local_a20,ZEXT1632(auVar85));
          auVar59 = vmaxps_avx(auVar89,ZEXT1632(auVar44));
          auVar59 = vcmpps_avx(auVar59,auVar21,2);
          auVar59 = vorps_avx(auVar46,auVar59);
          fVar94 = fStack_cac;
          fVar97 = fStack_ca8;
          fVar98 = fStack_ca4;
          auVar77._0_4_ = local_cb0;
          fVar99 = fStack_cdc;
          fVar100 = fStack_cd8;
          fVar101 = fStack_cd4;
          auVar66._0_4_ = local_ce0;
          if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar59 >> 0x7f,0) == '\0') &&
                (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar59 >> 0xbf,0) == '\0') &&
              (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar59[0x1f]) {
LAB_01490315:
            auVar103 = ZEXT1664(local_c80);
            auVar107 = ZEXT1664(local_c90);
            auVar110 = ZEXT1664(local_ca0);
            auVar116 = ZEXT1664(local_cc0);
            auVar83 = ZEXT1664(local_cd0);
            auVar119 = ZEXT1664(local_cf0);
            auVar70 = ZEXT1664(local_d00);
            auVar90 = ZEXT1664(local_d10);
            auVar96 = ZEXT1664(local_d20);
          }
          else {
            auVar22._4_4_ = fVar91 * local_b00._4_4_;
            auVar22._0_4_ = fVar84 * local_b00._0_4_;
            auVar22._8_4_ = fVar92 * local_b00._8_4_;
            auVar22._12_4_ = fVar93 * local_b00._12_4_;
            auVar22._16_4_ = fVar111 * local_b00._16_4_;
            auVar22._20_4_ = fVar112 * local_b00._20_4_;
            auVar22._24_4_ = fVar113 * local_b00._24_4_;
            auVar22._28_4_ = auVar46._28_4_;
            local_a60 = 0x80000000;
            uStack_a5c = 0x80000000;
            uStack_a58 = 0x80000000;
            uStack_a54 = 0x80000000;
            uStack_a50 = 0x80000000;
            uStack_a4c = 0x80000000;
            uStack_a48 = 0x80000000;
            uStack_a44 = 0x80000000;
            auVar23._4_4_ = local_b20._4_4_ * fVar71;
            auVar23._0_4_ = local_b20._0_4_ * fVar65;
            auVar23._8_4_ = local_b20._8_4_ * fVar72;
            auVar23._12_4_ = local_b20._12_4_ * fVar73;
            auVar23._16_4_ = local_b20._16_4_ * fVar74;
            auVar23._20_4_ = local_b20._20_4_ * fVar75;
            auVar23._24_4_ = local_b20._24_4_ * fVar76;
            auVar23._28_4_ = auVar89._28_4_;
            auVar45 = vfmsub213ps_fma(local_b20,local_b60,auVar22);
            auVar24._4_4_ = fVar120 * auVar47._4_4_;
            auVar24._0_4_ = fVar117 * auVar47._0_4_;
            auVar24._8_4_ = fVar121 * auVar47._8_4_;
            auVar24._12_4_ = fVar122 * auVar47._12_4_;
            auVar24._16_4_ = fVar123 * auVar47._16_4_;
            auVar24._20_4_ = fVar124 * auVar47._20_4_;
            auVar24._24_4_ = fVar125 * auVar47._24_4_;
            auVar24._28_4_ = 0x34000000;
            auVar25._4_4_ = fVar71 * auVar54._4_4_;
            auVar25._0_4_ = fVar65 * auVar54._0_4_;
            auVar25._8_4_ = fVar72 * auVar54._8_4_;
            auVar25._12_4_ = fVar73 * auVar54._12_4_;
            auVar25._16_4_ = fVar74 * auVar54._16_4_;
            auVar25._20_4_ = fVar75 * auVar54._20_4_;
            auVar25._24_4_ = fVar76 * auVar54._24_4_;
            auVar25._28_4_ = auVar13._28_4_;
            auVar44 = vfmsub213ps_fma(auVar54,local_b40,auVar24);
            auVar46 = vandps_avx(auVar22,auVar56);
            auVar89 = vandps_avx(auVar24,auVar56);
            auVar46 = vcmpps_avx(auVar46,auVar89,1);
            local_960 = vblendvps_avx(ZEXT1632(auVar44),ZEXT1632(auVar45),auVar46);
            auVar26._4_4_ = fVar91 * auVar14._4_4_;
            auVar26._0_4_ = fVar84 * auVar14._0_4_;
            auVar26._8_4_ = fVar92 * auVar14._8_4_;
            auVar26._12_4_ = fVar93 * auVar14._12_4_;
            auVar26._16_4_ = fVar111 * auVar14._16_4_;
            auVar26._20_4_ = fVar112 * auVar14._20_4_;
            auVar26._24_4_ = fVar113 * auVar14._24_4_;
            auVar26._28_4_ = auVar46._28_4_;
            auVar45 = vfmsub213ps_fma(auVar14,local_b60,auVar25);
            auVar27._4_4_ = local_ae0._4_4_ * fVar120;
            auVar27._0_4_ = local_ae0._0_4_ * fVar117;
            auVar27._8_4_ = local_ae0._8_4_ * fVar121;
            auVar27._12_4_ = local_ae0._12_4_ * fVar122;
            auVar27._16_4_ = local_ae0._16_4_ * fVar123;
            auVar27._20_4_ = local_ae0._20_4_ * fVar124;
            auVar27._24_4_ = local_ae0._24_4_ * fVar125;
            auVar27._28_4_ = auVar89._28_4_;
            auVar44 = vfmsub213ps_fma(local_b00,auVar13,auVar27);
            auVar46 = vandps_avx(auVar27,auVar56);
            auVar89 = vandps_avx(auVar25,auVar56);
            auVar46 = vcmpps_avx(auVar46,auVar89,1);
            local_940 = vblendvps_avx(ZEXT1632(auVar45),ZEXT1632(auVar44),auVar46);
            auVar45 = vfmsub213ps_fma(local_ae0,local_b40,auVar23);
            auVar44 = vfmsub213ps_fma(auVar47,auVar13,auVar26);
            auVar115._8_4_ = 0x3f800000;
            auVar115._0_8_ = 0x3f8000003f800000;
            auVar115._12_4_ = 0x3f800000;
            auVar115._16_4_ = 0x3f800000;
            auVar115._20_4_ = 0x3f800000;
            auVar115._24_4_ = 0x3f800000;
            auVar115._28_4_ = 0x3f800000;
            auVar46 = vandps_avx(auVar23,auVar56);
            auVar89 = vandps_avx(auVar26,auVar56);
            auVar46 = vcmpps_avx(auVar46,auVar89,1);
            local_920 = vblendvps_avx(ZEXT1632(auVar44),ZEXT1632(auVar45),auVar46);
            auVar45 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
            fVar65 = local_920._0_4_;
            fVar71 = local_920._4_4_;
            auVar28._4_4_ = fVar71 * local_bc0._4_4_;
            auVar28._0_4_ = fVar65 * local_bc0._4_4_;
            fVar72 = local_920._8_4_;
            auVar28._8_4_ = fVar72 * local_bc0._4_4_;
            fVar73 = local_920._12_4_;
            auVar28._12_4_ = fVar73 * local_bc0._4_4_;
            fVar74 = local_920._16_4_;
            auVar28._16_4_ = fVar74 * local_bc0._4_4_;
            fVar75 = local_920._20_4_;
            auVar28._20_4_ = fVar75 * local_bc0._4_4_;
            fVar76 = local_920._24_4_;
            auVar28._24_4_ = fVar76 * local_bc0._4_4_;
            auVar28._28_4_ = auVar59._28_4_;
            auVar44 = vfmadd213ps_fma(local_c40,local_940,auVar28);
            auVar44 = vfmadd213ps_fma(local_c60,local_960,ZEXT1632(auVar44));
            fVar84 = auVar44._0_4_ + auVar44._0_4_;
            fVar91 = auVar44._4_4_ + auVar44._4_4_;
            fVar92 = auVar44._8_4_ + auVar44._8_4_;
            fVar93 = auVar44._12_4_ + auVar44._12_4_;
            auVar89 = ZEXT1632(CONCAT412(fVar93,CONCAT48(fVar92,CONCAT44(fVar91,fVar84))));
            auVar63._0_4_ = fVar65 * fVar5;
            auVar63._4_4_ = fVar71 * fVar6;
            auVar63._8_4_ = fVar72 * fVar7;
            auVar63._12_4_ = fVar73 * fVar8;
            auVar63._16_4_ = fVar74 * fVar9;
            auVar63._20_4_ = fVar75 * fVar10;
            auVar63._24_4_ = fVar76 * fVar11;
            auVar63._28_4_ = 0;
            auVar44 = vfmadd213ps_fma(local_b80,local_940,auVar63);
            auVar86 = vfmadd213ps_fma(local_ac0,local_960,ZEXT1632(auVar44));
            auVar46 = vrcpps_avx(auVar89);
            auVar44 = vfnmadd213ps_fma(auVar46,auVar89,auVar115);
            auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar46,auVar46);
            local_8a0._28_4_ = auVar46._28_4_;
            local_8a0._0_28_ =
                 ZEXT1628(CONCAT412((auVar86._12_4_ + auVar86._12_4_) * auVar44._12_4_,
                                    CONCAT48((auVar86._8_4_ + auVar86._8_4_) * auVar44._8_4_,
                                             CONCAT44((auVar86._4_4_ + auVar86._4_4_) *
                                                      auVar44._4_4_,
                                                      (auVar86._0_4_ + auVar86._0_4_) *
                                                      auVar44._0_4_))));
            uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar106._4_4_ = uVar50;
            auVar106._0_4_ = uVar50;
            auVar106._8_4_ = uVar50;
            auVar106._12_4_ = uVar50;
            auVar106._16_4_ = uVar50;
            auVar106._20_4_ = uVar50;
            auVar106._24_4_ = uVar50;
            auVar106._28_4_ = uVar50;
            auVar46 = vcmpps_avx(auVar106,local_8a0,2);
            fVar5 = ray->tfar;
            auVar108._4_4_ = fVar5;
            auVar108._0_4_ = fVar5;
            auVar108._8_4_ = fVar5;
            auVar108._12_4_ = fVar5;
            auVar108._16_4_ = fVar5;
            auVar108._20_4_ = fVar5;
            auVar108._24_4_ = fVar5;
            auVar108._28_4_ = fVar5;
            auVar59 = vcmpps_avx(local_8a0,auVar108,2);
            auVar46 = vandps_avx(auVar46,auVar59);
            auVar109._0_8_ = CONCAT44(fVar91,fVar84) ^ 0x8000000080000000;
            auVar109._8_4_ = -fVar92;
            auVar109._12_4_ = -fVar93;
            auVar109._16_4_ = 0x80000000;
            auVar109._20_4_ = 0x80000000;
            auVar109._24_4_ = 0x80000000;
            auVar109._28_4_ = 0x80000000;
            auVar59 = vcmpps_avx(auVar109,auVar89,4);
            auVar46 = vandps_avx(auVar46,auVar59);
            auVar44 = vpackssdw_avx(auVar46._0_16_,auVar46._16_16_);
            auVar45 = vpand_avx(auVar44,auVar45);
            local_900 = vpmovsxwd_avx2(auVar45);
            if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_900 >> 0x7f,0) == '\0') &&
                  (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_900 >> 0xbf,0) == '\0') &&
                (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_900[0x1f]) goto LAB_01490315;
            local_ac0._0_8_ = lVar37;
            uStack_9b0 = 0;
            uStack_9ac = 0;
            uStack_9a8 = 0;
            uStack_9a4 = 0;
            local_9a0 = ZEXT1632(auVar85);
            auVar46 = vrcpps_avx(local_980);
            local_820 = local_a80;
            auVar44 = vfnmadd213ps_fma(local_980,auVar46,auVar115);
            auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar46,auVar46);
            auVar64._8_4_ = 0x219392ef;
            auVar64._0_8_ = 0x219392ef219392ef;
            auVar64._12_4_ = 0x219392ef;
            auVar64._16_4_ = 0x219392ef;
            auVar64._20_4_ = 0x219392ef;
            auVar64._24_4_ = 0x219392ef;
            auVar64._28_4_ = 0x219392ef;
            auVar46 = vcmpps_avx(local_a40,auVar64,5);
            auVar46 = vandps_avx(auVar46,ZEXT1632(auVar44));
            auVar29._4_4_ = fStack_9bc * auVar46._4_4_;
            auVar29._0_4_ = local_9c0 * auVar46._0_4_;
            auVar29._8_4_ = fStack_9b8 * auVar46._8_4_;
            auVar29._12_4_ = fStack_9b4 * auVar46._12_4_;
            auVar29._16_4_ = auVar46._16_4_ * 0.0;
            auVar29._20_4_ = auVar46._20_4_ * 0.0;
            auVar29._24_4_ = auVar46._24_4_ * 0.0;
            auVar29._28_4_ = 0;
            auVar59 = vminps_avx(auVar29,auVar115);
            auVar30._4_4_ = auVar85._4_4_ * auVar46._4_4_;
            auVar30._0_4_ = auVar85._0_4_ * auVar46._0_4_;
            auVar30._8_4_ = auVar85._8_4_ * auVar46._8_4_;
            auVar30._12_4_ = auVar85._12_4_ * auVar46._12_4_;
            auVar30._16_4_ = auVar46._16_4_ * 0.0;
            auVar30._20_4_ = auVar46._20_4_ * 0.0;
            auVar30._24_4_ = auVar46._24_4_ * 0.0;
            auVar30._28_4_ = auVar46._28_4_;
            auVar46 = vminps_avx(auVar30,auVar115);
            auVar89 = vsubps_avx(auVar115,auVar59);
            auVar47 = vsubps_avx(auVar115,auVar46);
            local_8c0 = vblendvps_avx(auVar46,auVar89,local_a80);
            local_8e0 = vblendvps_avx(auVar59,auVar47,local_a80);
            local_860._4_4_ = (float)local_aa0._4_4_ * local_940._4_4_;
            local_860._0_4_ = (float)local_aa0._0_4_ * local_940._0_4_;
            local_860._8_4_ = fStack_a98 * local_940._8_4_;
            local_860._12_4_ = fStack_a94 * local_940._12_4_;
            local_860._16_4_ = fStack_a90 * local_940._16_4_;
            local_860._20_4_ = fStack_a8c * local_940._20_4_;
            local_860._24_4_ = fStack_a88 * local_940._24_4_;
            local_860._28_4_ = local_8c0._28_4_;
            local_880[0] = local_960._0_4_ * (float)local_aa0._0_4_;
            local_880[1] = local_960._4_4_ * (float)local_aa0._4_4_;
            local_880[2] = local_960._8_4_ * fStack_a98;
            local_880[3] = local_960._12_4_ * fStack_a94;
            fStack_870 = local_960._16_4_ * fStack_a90;
            fStack_86c = local_960._20_4_ * fStack_a8c;
            fStack_868 = local_960._24_4_ * fStack_a88;
            uStack_864 = local_8e0._28_4_;
            local_840[0] = (float)local_aa0._0_4_ * fVar65;
            local_840[1] = (float)local_aa0._4_4_ * fVar71;
            local_840[2] = fStack_a98 * fVar72;
            local_840[3] = fStack_a94 * fVar73;
            fStack_830 = fStack_a90 * fVar74;
            fStack_82c = fStack_a8c * fVar75;
            fStack_828 = fStack_a88 * fVar76;
            uStack_824 = local_920._28_4_;
            auVar45 = vpsllw_avx(auVar45,0xf);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            uVar32 = (ulong)(byte)(SUB161(auVar45 >> 7,0) & 1 | (SUB161(auVar45 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar45 >> 0x3f,0) << 7);
            auVar103 = ZEXT1664(local_c80);
            auVar107 = ZEXT1664(local_c90);
            auVar110 = ZEXT1664(local_ca0);
            auVar116 = ZEXT1664(local_cc0);
            auVar83 = ZEXT1664(local_cd0);
            auVar119 = ZEXT1664(local_cf0);
            auVar70 = ZEXT1664(local_d00);
            auVar90 = ZEXT1664(local_d10);
            auVar96 = ZEXT1664(local_d20);
            local_c40._0_8_ = context->scene;
            pSVar35 = context->scene;
            do {
              uVar34 = 0;
              for (uVar15 = uVar32; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                uVar34 = uVar34 + 1;
              }
              local_c08 = *(uint *)((long)&local_9e0 + uVar34 * 4);
              pGVar4 = (pSVar35->geometries).items[local_c08].ptr;
              if ((pGVar4->mask & ray->mask) == 0) {
                uVar32 = uVar32 ^ 1L << (uVar34 & 0x3f);
              }
              else {
                local_c60._0_8_ = uVar34;
                local_bc0 = uVar32;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0149038b;
                local_b80._0_8_ = context->args;
                local_b20._0_8_ = uVar40;
                local_b00._0_8_ = uVar36;
                local_ae0._0_8_ = puVar39;
                uVar36 = (ulong)(uint)((int)uVar34 * 4);
                local_bf0.context = context->user;
                local_c20 = *(undefined4 *)((long)local_880 + uVar36);
                local_c1c = *(undefined4 *)(local_860 + uVar36);
                local_c18 = *(undefined4 *)((long)local_840 + uVar36);
                local_c14 = *(undefined4 *)(local_8e0 + uVar36);
                local_c10 = *(undefined4 *)(local_8c0 + uVar36);
                local_c0c = *(undefined4 *)((long)&local_a00 + uVar36);
                local_c04 = (local_bf0.context)->instID[0];
                local_c00 = (local_bf0.context)->instPrimID[0];
                local_b40._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_8a0 + uVar36);
                local_d24 = -1;
                local_bf0.valid = &local_d24;
                local_bf0.geometryUserPtr = pGVar4->userPtr;
                local_ba0._0_8_ = ray;
                local_bf0.hit = (RTCHitN *)&local_c20;
                local_bf0.N = 1;
                local_b60._0_8_ = pGVar4;
                local_bf0.ray = (RTCRayN *)ray;
                if ((pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar4->occlusionFilterN)(&local_bf0), *local_bf0.valid != 0)) {
                  ray = (Ray *)local_ba0._0_8_;
                  if ((*(code **)(local_b80._0_8_ + 0x10) == (code *)0x0) ||
                     (((*(byte *)local_b80._0_8_ & 2) == 0 &&
                      ((*(byte *)(local_b60._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_0149038b:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  (**(code **)(local_b80._0_8_ + 0x10))(&local_bf0);
                  ray = (Ray *)local_ba0._0_8_;
                  if (*local_bf0.valid != 0) goto LAB_0149038b;
                }
                *(undefined4 *)(local_ba0._0_8_ + 0x20) = local_b40._0_4_;
                uVar32 = local_bc0 ^ 1L << (local_c60._0_8_ & 0x3f);
                auVar103 = ZEXT1664(local_c80);
                auVar107 = ZEXT1664(local_c90);
                auVar110 = ZEXT1664(local_ca0);
                auVar116 = ZEXT1664(local_cc0);
                auVar83 = ZEXT1664(local_cd0);
                auVar119 = ZEXT1664(local_cf0);
                auVar70 = ZEXT1664(local_d00);
                auVar90 = ZEXT1664(local_d10);
                auVar96 = ZEXT1664(local_d20);
                ray = (Ray *)local_ba0._0_8_;
                puVar39 = (ulong *)local_ae0._0_8_;
                uVar36 = local_b00._0_8_;
                uVar40 = local_b20._0_8_;
                auVar77._0_4_ = local_cb0;
                fVar94 = fStack_cac;
                fVar97 = fStack_ca8;
                fVar98 = fStack_ca4;
                auVar66._0_4_ = local_ce0;
                fVar99 = fStack_cdc;
                fVar100 = fStack_cd8;
                fVar101 = fStack_cd4;
              }
              pSVar35 = (Scene *)local_c40._0_8_;
            } while (uVar32 != 0);
            lVar37 = local_ac0._0_8_;
          }
        }
        goto LAB_0148f9be;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }